

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O1

QVariant * __thiscall
QBmpHandler::option(QVariant *__return_storage_ptr__,QBmpHandler *this,ImageOption option)

{
  QSize QVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  
  if (option != ImageFormat) {
    if (option == Size) {
      if (this->state == Ready) {
        bVar3 = readHeader(this);
        if (bVar3) goto LAB_0026e1bb;
      }
      else if (this->state != Error) {
LAB_0026e1bb:
        QVar1.wd.m_i = (this->infoHeader).biWidth;
        QVar1.ht.m_i = (this->infoHeader).biHeight;
        ::QVariant::QVariant(__return_storage_ptr__,QVar1);
        return __return_storage_ptr__;
      }
    }
LAB_0026e215:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    return __return_storage_ptr__;
  }
  if (this->state == Ready) {
    bVar3 = readHeader(this);
    if (!bVar3) goto LAB_0026e215;
  }
  else if (this->state == Error) goto LAB_0026e215;
  iVar4 = (int)(this->infoHeader).biBitCount;
  uVar2 = iVar4 - 4U >> 2;
  if ((iVar4 << 0x1e | uVar2) < 8) {
    if ((0xa8U >> (uVar2 & 0x1f) & 1) != 0) {
      if (((1 < (this->infoHeader).biCompression - 3U) || ((this->infoHeader).biSize < 0x6c)) ||
         (iVar4 = 5, (this->infoHeader).biAlphaMask == 0)) {
        iVar4 = 4;
      }
      goto LAB_0026e24a;
    }
    iVar4 = 3;
    if ((3U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_0026e24a;
  }
  iVar4 = 1;
LAB_0026e24a:
  ::QVariant::QVariant(__return_storage_ptr__,iVar4);
  return __return_storage_ptr__;
}

Assistant:

QVariant QBmpHandler::option(ImageOption option) const
{
    if (option == Size) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QBmpHandler*>(this)->readHeader())
            return QVariant();
        return QSize(infoHeader.biWidth, infoHeader.biHeight);
    } else if (option == ImageFormat) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QBmpHandler*>(this)->readHeader())
            return QVariant();
        QImage::Format format;
        switch (infoHeader.biBitCount) {
            case 32:
            case 24:
            case 16:
                if ((infoHeader.biCompression == BMP_BITFIELDS || infoHeader.biCompression == BMP_ALPHABITFIELDS) && infoHeader.biSize >= BMP_WIN4 && infoHeader.biAlphaMask)
                    format = QImage::Format_ARGB32;
                else
                    format = QImage::Format_RGB32;
                break;
            case 8:
            case 4:
                format = QImage::Format_Indexed8;
                break;
            default:
                format = QImage::Format_Mono;
            }
        return format;
    }
    return QVariant();
}